

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uparse.cpp
# Opt level: O0

void u_parseDelimitedFile
               (char *filename,char delimiter,char *(*fields) [2],int32_t fieldCount,
               UParseLineFn *lineFn,void *context,UErrorCode *pErrorCode)

{
  UBool UVar1;
  char *pcVar2;
  bool bVar3;
  int local_276c;
  int32_t length;
  int32_t i;
  char *limit;
  char *start;
  char line [10000];
  FileStream *local_40;
  FileStream *file;
  void *context_local;
  UParseLineFn *lineFn_local;
  int32_t fieldCount_local;
  char *(*fields_local) [2];
  char *pcStack_10;
  char delimiter_local;
  char *filename_local;
  
  UVar1 = U_FAILURE(*pErrorCode);
  if (UVar1 == '\0') {
    if (((fields == (char *(*) [2])0x0) || (lineFn == (UParseLineFn *)0x0)) || (fieldCount < 1)) {
      *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      if (((filename == (char *)0x0) || (*filename == '\0')) ||
         ((*filename == '-' && (filename[1] == '\0')))) {
        pcStack_10 = (char *)0x0;
        local_40 = T_FileStream_stdin();
      }
      else {
        local_40 = T_FileStream_open(filename,"r");
        pcStack_10 = filename;
      }
      if (local_40 == (FileStream *)0x0) {
        *pErrorCode = U_FILE_ACCESS_ERROR;
      }
      else {
        do {
          do {
            do {
              pcVar2 = T_FileStream_readLine(local_40,(char *)&start,10000);
              if (pcVar2 == (char *)0x0) goto LAB_00211b85;
              u_rtrim((char *)&start);
              limit = getMissingLimit((char *)&start);
              if ((char **)limit == &start) {
                *pErrorCode = U_ZERO_ERROR;
              }
              else {
                *pErrorCode = U_USING_DEFAULT_WARNING;
              }
            } while ((*limit == '\0') || (*limit == '#'));
            _length = (char **)strchr(limit,0x23);
            if (_length != (char **)0x0) {
              while( true ) {
                bVar3 = false;
                if ((((limit < _length) && (bVar3 = true, *(char *)((long)_length + -1) != ' ')) &&
                    (bVar3 = true, *(char *)((long)_length + -1) != '\t')) &&
                   (bVar3 = true, *(char *)((long)_length + -1) != '\r')) {
                  bVar3 = *(char *)((long)_length + -1) == '\n';
                }
                if (!bVar3) break;
                _length = (char **)((long)_length + -1);
              }
              *(char *)_length = '\0';
            }
            pcVar2 = u_skipWhitespace(limit);
          } while (*pcVar2 == '\0');
          for (local_276c = 0; local_276c < fieldCount; local_276c = local_276c + 1) {
            _length = (char **)limit;
            while( true ) {
              bVar3 = false;
              if (*(char *)_length != delimiter) {
                bVar3 = *(char *)_length != '\0';
              }
              if (!bVar3) break;
              _length = (char **)((long)_length + 1);
            }
            fields[local_276c][0] = limit;
            fields[local_276c][1] = (char *)_length;
            limit = (char *)_length;
            if (*(char *)_length == '\0') {
              if (local_276c + 1 < fieldCount) {
                *pErrorCode = U_PARSE_ERROR;
                break;
              }
            }
            else {
              limit = (char *)((long)_length + 1);
            }
          }
          UVar1 = U_FAILURE(*pErrorCode);
          if (UVar1 != '\0') break;
          (*lineFn)(context,fields,fieldCount,pErrorCode);
          UVar1 = U_FAILURE(*pErrorCode);
        } while (UVar1 == '\0');
LAB_00211b85:
        if (pcStack_10 != (char *)0x0) {
          T_FileStream_close(local_40);
        }
      }
    }
  }
  return;
}

Assistant:

U_CAPI void U_EXPORT2
u_parseDelimitedFile(const char *filename, char delimiter,
                     char *fields[][2], int32_t fieldCount,
                     UParseLineFn *lineFn, void *context,
                     UErrorCode *pErrorCode) {
    FileStream *file;
    char line[10000];
    char *start, *limit;
    int32_t i, length;

    if(U_FAILURE(*pErrorCode)) {
        return;
    }

    if(fields==NULL || lineFn==NULL || fieldCount<=0) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }

    if(filename==NULL || *filename==0 || (*filename=='-' && filename[1]==0)) {
        filename=NULL;
        file=T_FileStream_stdin();
    } else {
        file=T_FileStream_open(filename, "r");
    }
    if(file==NULL) {
        *pErrorCode=U_FILE_ACCESS_ERROR;
        return;
    }

    while(T_FileStream_readLine(file, line, sizeof(line))!=NULL) {
        /* remove trailing newline characters */
        length=(int32_t)(u_rtrim(line)-line);

        /*
         * detect a line with # @missing:
         * start parsing after that, or else from the beginning of the line
         * set the default warning for @missing lines
         */
        start=(char *)getMissingLimit(line);
        if(start==line) {
            *pErrorCode=U_ZERO_ERROR;
        } else {
            *pErrorCode=U_USING_DEFAULT_WARNING;
        }

        /* skip this line if it is empty or a comment */
        if(*start==0 || *start=='#') {
            continue;
        }

        /* remove in-line comments */
        limit=uprv_strchr(start, '#');
        if(limit!=NULL) {
            /* get white space before the pound sign */
            while(limit>start && U_IS_INV_WHITESPACE(*(limit-1))) {
                --limit;
            }

            /* truncate the line */
            *limit=0;
        }

        /* skip lines with only whitespace */
        if(u_skipWhitespace(start)[0]==0) {
            continue;
        }

        /* for each field, call the corresponding field function */
        for(i=0; i<fieldCount; ++i) {
            /* set the limit pointer of this field */
            limit=start;
            while(*limit!=delimiter && *limit!=0) {
                ++limit;
            }

            /* set the field start and limit in the fields array */
            fields[i][0]=start;
            fields[i][1]=limit;

            /* set start to the beginning of the next field, if any */
            start=limit;
            if(*start!=0) {
                ++start;
            } else if(i+1<fieldCount) {
                *pErrorCode=U_PARSE_ERROR;
                limit=line+length;
                i=fieldCount;
                break;
            }
        }

        /* too few fields? */
        if(U_FAILURE(*pErrorCode)) {
            break;
        }

        /* call the field function */
        lineFn(context, fields, fieldCount, pErrorCode);
        if(U_FAILURE(*pErrorCode)) {
            break;
        }
    }

    if(filename!=NULL) {
        T_FileStream_close(file);
    }
}